

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

void __thiscall
Network::Address::IPV6::IPV6
          (IPV6 *this,uint16 a,uint16 b,uint16 c,uint16 d,uint16 e,uint16 f,uint16 g,uint16 h,
          uint16 port)

{
  uint16_t uVar1;
  uint16 e_local;
  uint16 d_local;
  uint16 c_local;
  uint16 b_local;
  uint16 a_local;
  IPV6 *this_local;
  
  BaseAddress::BaseAddress(&this->super_BaseAddress);
  (this->super_BaseAddress)._vptr_BaseAddress = (_func_int **)&PTR_asText_0014df20;
  memset(&this->address,0,0x1c);
  (this->address).sin6_family = 10;
  uVar1 = htons(port);
  (this->address).sin6_port = uVar1;
  (this->address).sin6_addr.__in6_u.__u6_addr8[0] = (uint8_t)(a >> 8);
  (this->address).sin6_addr.__in6_u.__u6_addr8[1] = (uint8_t)a;
  (this->address).sin6_addr.__in6_u.__u6_addr8[2] = (uint8_t)(b >> 8);
  (this->address).sin6_addr.__in6_u.__u6_addr8[3] = (uint8_t)b;
  (this->address).sin6_addr.__in6_u.__u6_addr8[4] = (uint8_t)(c >> 8);
  (this->address).sin6_addr.__in6_u.__u6_addr8[5] = (uint8_t)c;
  (this->address).sin6_addr.__in6_u.__u6_addr8[6] = (uint8_t)(d >> 8);
  (this->address).sin6_addr.__in6_u.__u6_addr8[7] = (uint8_t)d;
  (this->address).sin6_addr.__in6_u.__u6_addr8[8] = (uint8_t)(e >> 8);
  (this->address).sin6_addr.__in6_u.__u6_addr8[9] = (uint8_t)e;
  (this->address).sin6_addr.__in6_u.__u6_addr8[10] = (uint8_t)(f >> 8);
  (this->address).sin6_addr.__in6_u.__u6_addr8[0xb] = (uint8_t)f;
  (this->address).sin6_addr.__in6_u.__u6_addr8[0xc] = (uint8_t)(g >> 8);
  (this->address).sin6_addr.__in6_u.__u6_addr8[0xd] = (uint8_t)g;
  (this->address).sin6_addr.__in6_u.__u6_addr8[0xe] = (uint8_t)(h >> 8);
  (this->address).sin6_addr.__in6_u.__u6_addr8[0xf] = (uint8_t)h;
  return;
}

Assistant:

IPV6::IPV6(const uint16 a, const uint16 b, const uint16 c, const uint16 d,
                   const uint16 e, const uint16 f, const uint16 g, const uint16 h,
                   const uint16 port)
        {
            memset(&address, 0, sizeof(address));
            address.sin6_family = AF_INET6;
            address.sin6_port = htons(port);
#define SetAddr(X, Y) ((uint8*)&address.sin6_addr)[X] = Y >> 8; ((uint8*)&address.sin6_addr)[X+1] = Y & 0xFF
            SetAddr(0, a); SetAddr(2, b); SetAddr(4, c); SetAddr(6, d); SetAddr(8, e); SetAddr(10, f); SetAddr(12, g); SetAddr(14, h);
#undef SetAddr
        }